

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void av1_loop_restoration_filter_frame
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,void *lr_ctxt)

{
  int iVar1;
  code *pcVar2;
  int32_t *piVar3;
  RestorationLineBuffers *pRVar4;
  uint uVar5;
  undefined8 *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  undefined4 *puVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  int local_a0;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  aom_internal_error_info *local_38;
  
  uVar5 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  av1_loop_restoration_filter_frame_init((AV1LrStruct *)lr_ctxt,frame,cm,optimized_lr,uVar5);
  local_58 = (long)lr_ctxt + 8;
  uVar9 = 0;
  local_60 = (undefined8 *)lr_ctxt;
  local_50 = (ulong)uVar5;
  do {
    if (cm->rst_info[uVar9].frame_restoration_type != RESTORE_NONE) {
      if (uVar9 == 0) {
        bVar18 = false;
        bVar19 = false;
      }
      else {
        bVar18 = cm->seq_params->subsampling_y != 0;
        bVar19 = cm->seq_params->subsampling_x != 0;
      }
      iVar15 = (int)(((uint)(1 << bVar19) >> 1) + cm->superres_upscaled_width) >> bVar19;
      iVar13 = (int)(((uint)(1 << bVar18) >> 1) + cm->height) >> bVar18;
      if (0 < iVar13) {
        pcVar2 = (code *)*local_60;
        lVar8 = uVar9 * 0x38 + local_58;
        piVar3 = cm->rst_tmpbuf;
        pRVar4 = cm->rlbs;
        uVar5 = cm->rst_info[uVar9].restoration_unit_size;
        uVar16 = (ulong)uVar5;
        iVar1 = cm->rst_info[uVar9].horz_units;
        iVar12 = (int)(uVar5 * 3) / 2;
        local_a0 = 0;
        iVar10 = 0;
        local_48 = uVar16;
        local_40 = lVar8;
        do {
          iVar14 = iVar13 - iVar10;
          if (iVar12 <= iVar14) {
            iVar14 = (int)uVar16;
          }
          iVar14 = iVar14 + iVar10;
          local_68 = iVar10 - (8U >> bVar18);
          if (local_68 < 1) {
            local_68 = 0;
          }
          local_64 = iVar14;
          if (iVar14 < iVar13) {
            local_64 = iVar14 - (8U >> bVar18);
          }
          if (0 < iVar15) {
            local_38 = cm->error;
            iVar10 = 0;
            iVar17 = local_a0;
            do {
              iVar7 = iVar15 - iVar10;
              if (iVar12 <= iVar7) {
                iVar7 = (int)uVar16;
              }
              iVar7 = iVar10 + iVar7;
              local_70 = iVar10;
              local_6c = iVar7;
              (*pcVar2)(&local_70,iVar17,lVar8,piVar3,pRVar4,local_38);
              iVar17 = iVar17 + 1;
              lVar8 = local_40;
              uVar16 = local_48;
              iVar10 = iVar7;
            } while (iVar7 < iVar15);
          }
          local_a0 = local_a0 + iVar1;
          iVar10 = iVar14;
        } while (iVar14 < iVar13);
      }
    }
    puVar6 = local_60;
    uVar9 = uVar9 + 1;
  } while (uVar9 != local_50);
  iVar13 = (int)local_50;
  puVar11 = (undefined4 *)((long)local_60 + 0x1c);
  uVar9 = 0;
  do {
    if ((&cm->rst_info[0].frame_restoration_type)[uVar9 * 2] != RESTORE_NONE) {
      (**(code **)((long)&loop_restoration_copy_planes_copy_funs + uVar9))
                (puVar6[0x17],puVar6[0x16],0,puVar11[-1],0,*puVar11);
    }
    uVar9 = uVar9 + 8;
    puVar11 = puVar11 + 0xe;
  } while ((uint)(iVar13 << 3) != uVar9);
  return;
}

Assistant:

void av1_loop_restoration_filter_frame(YV12_BUFFER_CONFIG *frame,
                                       AV1_COMMON *cm, int optimized_lr,
                                       void *lr_ctxt) {
  assert(!cm->features.all_lossless);
  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes(loop_rest_ctxt, cm, num_planes);

  loop_restoration_copy_planes(loop_rest_ctxt, cm, num_planes);
}